

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

int ExecuteShellCommand(CStringRef command,bool throw_on_nonzero_exit_code)

{
  uint uVar1;
  int *piVar2;
  Error *this;
  
  uVar1 = system(command.data_);
  if (uVar1 == 0xffffffff) {
    this = (Error *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    mp::Error::Error(this,(CStringRef)0x228743,*piVar2);
  }
  else if ((uVar1 & 0x7f) == 0) {
    uVar1 = uVar1 >> 8 & 0xff;
    if (!throw_on_nonzero_exit_code || uVar1 == 0) {
      return uVar1;
    }
    this = (Error *)__cxa_allocate_exception(0x18);
    mp::Error::Error(this,(CStringRef)0x228792,uVar1);
  }
  else {
    this = (Error *)__cxa_allocate_exception(0x18);
    mp::Error::Error(this,(CStringRef)0x228762,uVar1);
  }
  __cxa_throw(this,&mp::Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

int ExecuteShellCommand(
    fmt::CStringRef command, bool throw_on_nonzero_exit_code) {
#ifdef _WIN32
  std::wstring command_str = fmt::internal::UTF8ToUTF16(command.c_str()).str();
  std::replace(command_str.begin(), command_str.end(), L'/', L'\\');
  int result = _wsystem(command_str.c_str());
#else
  int result = std::system(command.c_str());
#endif
  // Check if system function failed.
  if (result == -1)
    throw mp::Error("system failed, error code = {}", errno);
  // Check if process hasn't exited normally.
  if (!WIFEXITED(result)) {
    throw mp::Error(
        "process hasn't exited normally, error code = {}", result);
  }
  // Process exited normally - check exit code.
  int exit_code = WEXITSTATUS(result);
  if (exit_code != 0 && throw_on_nonzero_exit_code)
    throw mp::Error("process exited with code {}", exit_code);
  return exit_code;
}